

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Int64Range *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Int64Range>(Arena *arena)

{
  Int64Range *this;
  
  if (arena == (Arena *)0x0) {
    this = (Int64Range *)operator_new(0x28);
    CoreML::Specification::Int64Range::Int64Range(this,(Arena *)0x0,false);
  }
  else {
    this = (Int64Range *)
           AllocateAlignedWithHook
                     (arena,0x28,(type_info *)&CoreML::Specification::Int64Range::typeinfo);
    CoreML::Specification::Int64Range::Int64Range(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }